

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

bool __thiscall kws::Parser::IsInUnion(Parser *this,size_t pos,char *buffer)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  ulong pos_00;
  allocator local_71;
  string buf;
  string local_50;
  
  std::__cxx11::string::string((string *)&buf,(string *)&this->m_BufferNoComment);
  if (buffer != (char *)0x0) {
    std::__cxx11::string::assign((char *)&buf);
  }
  if ((pos == 0xffffffffffffffff) || (buf._M_string_length - 1 < pos)) {
LAB_0011d64b:
    bVar3 = false;
  }
  else {
    do {
      uVar1 = std::__cxx11::string::find((char *)&buf,0x1554f4);
      bVar3 = uVar1 != 0xffffffffffffffff;
      if (uVar1 == 0xffffffffffffffff) goto LAB_0011d64b;
      uVar4 = uVar1;
      if (uVar1 <= buf._M_string_length) {
        uVar4 = buf._M_string_length;
      }
      for (; (pos_00 = uVar4, uVar1 < buf._M_string_length &&
             (pos_00 = uVar1, buf._M_dataplus._M_p[uVar1] != '{')); uVar1 = uVar1 + 1) {
      }
      std::__cxx11::string::string((string *)&local_50,"",&local_71);
      sVar2 = FindClosingChar(this,'{','}',pos_00,true,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    } while ((pos <= pos_00) || (sVar2 <= pos));
  }
  std::__cxx11::string::~string((string *)&buf);
  return bVar3;
}

Assistant:

bool Parser::IsInUnion(size_t pos,const char* buffer) const
{
  std::string buf = m_BufferNoComment;
  if(buffer)
    {
    buf = buffer;
    }

  if((pos == std::string::npos) || pos > buf.size()-1)
    {
    return false;
    }

  size_t b = buf.find("union",0);
  while(b!=std::string::npos)
    {
    while(b<buf.size())
      {
      if(buf[b] == '{')
        {
        break;
        }
      b++;
      }

    size_t c=this->FindClosingChar('{','}',b,true);
    if(pos<c && pos>b)
      {
      return true;
      }
    b = buf.find("union",b+1);
    }
  return false;
}